

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O3

int mbedtls_poly1305_self_test(int verbose)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  undefined1 auVar4 [16];
  uchar mac [16];
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  lVar3 = 0;
  bVar2 = true;
  while( true ) {
    if (verbose != 0) {
      printf("  Poly1305 test %u ",lVar3);
    }
    mbedtls_poly1305_mac(test_keys[lVar3],test_data[lVar3],test_data_len[lVar3],&local_48);
    auVar4[0] = -(test_mac[lVar3][0] == local_48);
    auVar4[1] = -(test_mac[lVar3][1] == uStack_47);
    auVar4[2] = -(test_mac[lVar3][2] == uStack_46);
    auVar4[3] = -(test_mac[lVar3][3] == uStack_45);
    auVar4[4] = -(test_mac[lVar3][4] == uStack_44);
    auVar4[5] = -(test_mac[lVar3][5] == uStack_43);
    auVar4[6] = -(test_mac[lVar3][6] == uStack_42);
    auVar4[7] = -(test_mac[lVar3][7] == uStack_41);
    auVar4[8] = -(test_mac[lVar3][8] == uStack_40);
    auVar4[9] = -(test_mac[lVar3][9] == uStack_3f);
    auVar4[10] = -(test_mac[lVar3][10] == uStack_3e);
    auVar4[0xb] = -(test_mac[lVar3][0xb] == uStack_3d);
    auVar4[0xc] = -(test_mac[lVar3][0xc] == uStack_3c);
    auVar4[0xd] = -(test_mac[lVar3][0xd] == uStack_3b);
    auVar4[0xe] = -(test_mac[lVar3][0xe] == uStack_3a);
    auVar4[0xf] = -(test_mac[lVar3][0xf] == uStack_39);
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf)
        != 0xffff) break;
    if (verbose == 0) {
      lVar3 = 1;
      bVar1 = !bVar2;
      bVar2 = false;
      if (bVar1) {
        return 0;
      }
    }
    else {
      puts("passed");
      lVar3 = 1;
      bVar1 = !bVar2;
      bVar2 = false;
      if (bVar1) {
        putchar(10);
        return 0;
      }
    }
  }
  if (verbose == 0) {
    return -1;
  }
  puts("failed (mac)");
  return -1;
}

Assistant:

int mbedtls_poly1305_self_test( int verbose )
{
    unsigned char mac[16];
    unsigned i;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    for( i = 0U; i < 2U; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  Poly1305 test %u ", i );

        ret = mbedtls_poly1305_mac( test_keys[i],
                                    test_data[i],
                                    test_data_len[i],
                                    mac );
        ASSERT( 0 == ret, ( "error code: %i\n", ret ) );

        ASSERT( 0 == memcmp( mac, test_mac[i], 16U ), ( "failed (mac)\n" ) );

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}